

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O0

void TemplateCacheUnittest::TestStringTemplateInclude(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  byte bVar5;
  allocator local_359;
  string local_358 [8];
  string expected;
  TemplateString local_338;
  TemplateString local_318;
  TemplateString local_2f8;
  TemplateString local_2d8;
  undefined8 local_2b8;
  TemplateDictionary *sub_dict;
  TemplateDictionary local_290 [8];
  TemplateDictionary dict;
  TemplateString local_220;
  long local_200;
  Template *tpl;
  TemplateString local_1d8;
  TemplateString local_1b8;
  TemplateString local_198;
  TemplateString local_178;
  TemplateString local_158;
  TemplateString local_138;
  TemplateString local_118;
  undefined1 local_f8 [8];
  TemplateCache cache;
  allocator local_b1;
  string local_b0 [8];
  string text_inc;
  allocator local_89;
  string local_88 [8];
  string text;
  allocator local_61;
  string local_60 [8];
  string cache_key_inc;
  allocator local_29;
  string local_28 [8];
  string cache_key;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"TestStringTemplateInclude",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"TestStringTemplateInclude-inc",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"<html>{{>INC}}</html>",&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"<div>\n<p>\nUser {{USER}}\n</div>",&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_f8);
  ctemplate::TemplateString::TemplateString(&local_118,(string *)local_28);
  ctemplate::TemplateString::TemplateString(&local_138,(string *)local_88);
  bVar5 = ctemplate::TemplateCache::StringToTemplateCache
                    ((TemplateString *)local_f8,&local_118,(Strip)&local_138);
  if (((bVar5 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x3a1,
           "cache.StringToTemplateCache(cache_key, text, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_158,(string *)local_28);
    ctemplate::TemplateString::TemplateString(&local_178,(string *)local_88);
    bVar5 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)local_f8,&local_158,(Strip)&local_178);
    if ((bVar5 & 1) == 0) {
      __assert_fail("cache.StringToTemplateCache(cache_key, text, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3a1,"static void TemplateCacheUnittest::TestStringTemplateInclude()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_198,(string *)local_60);
  ctemplate::TemplateString::TemplateString(&local_1b8,(string *)local_b0);
  bVar5 = ctemplate::TemplateCache::StringToTemplateCache
                    ((TemplateString *)local_f8,&local_198,(Strip)&local_1b8);
  if (((bVar5 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x3a2,
           "cache.StringToTemplateCache(cache_key_inc, text_inc, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_1d8,(string *)local_60);
    ctemplate::TemplateString::TemplateString((TemplateString *)&tpl,(string *)local_b0);
    bVar5 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)local_f8,&local_1d8,(Strip)&tpl);
    if ((bVar5 & 1) == 0) {
      __assert_fail("cache.StringToTemplateCache(cache_key_inc, text_inc, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3a2,"static void TemplateCacheUnittest::TestStringTemplateInclude()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_220,(string *)local_28);
  local_200 = ctemplate::TemplateCache::GetTemplate((TemplateString *)local_f8,(Strip)&local_220);
  if (local_200 != 0) {
    ctemplate::TemplateString::TemplateString((TemplateString *)&sub_dict,"dict");
    ctemplate::TemplateDictionary::TemplateDictionary
              (local_290,(TemplateString *)&sub_dict,(UnsafeArena *)0x0);
    ctemplate::TemplateString::TemplateString(&local_2d8,"INC");
    TVar1.length_ = local_2d8.length_;
    TVar1.ptr_ = local_2d8.ptr_;
    TVar1.is_immutable_ = local_2d8.is_immutable_;
    TVar1._17_7_ = local_2d8._17_7_;
    TVar1.id_ = local_2d8.id_;
    local_2b8 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
    ctemplate::TemplateString::TemplateString(&local_2f8,(string *)local_60);
    TVar2.length_ = local_2f8.length_;
    TVar2.ptr_ = local_2f8.ptr_;
    TVar2.is_immutable_ = local_2f8.is_immutable_;
    TVar2._17_7_ = local_2f8._17_7_;
    TVar2.id_ = local_2f8.id_;
    ctemplate::TemplateDictionary::SetFilename(TVar2);
    ctemplate::TemplateString::TemplateString(&local_318,"USER");
    ctemplate::TemplateString::TemplateString(&local_338,"John<>Doe");
    TVar3.length_ = local_318.length_;
    TVar3.ptr_ = local_318.ptr_;
    TVar3.is_immutable_ = local_318.is_immutable_;
    TVar3._17_7_ = local_318._17_7_;
    TVar3.id_ = local_318.id_;
    TVar4.length_ = local_338.length_;
    TVar4.ptr_ = local_338.ptr_;
    TVar4.is_immutable_ = local_338.is_immutable_;
    TVar4._17_7_ = local_338._17_7_;
    TVar4.id_ = local_338.id_;
    ctemplate::TemplateDictionary::SetValue(TVar3,TVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_358,"<html><div>\n<p>\nUser John<>Doe\n</div></html>",&local_359);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
    ctemplate::AssertExpandWithCacheIs
              ((TemplateCache *)local_f8,(string *)local_28,DO_NOT_STRIP,local_290,
               (PerExpandData *)0x0,(string *)local_358,true);
    std::__cxx11::string::~string(local_358);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_290);
    ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_f8);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_28);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x3a5,"tpl");
  if (local_200 != 0) {
    exit(1);
  }
  __assert_fail("tpl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                ,0x3a5,"static void TemplateCacheUnittest::TestStringTemplateInclude()");
}

Assistant:

static void TestStringTemplateInclude() {
    const string cache_key = "TestStringTemplateInclude";
    const string cache_key_inc = "TestStringTemplateInclude-inc";
    const string text = "<html>{{>INC}}</html>";
    const string text_inc = "<div>\n<p>\nUser {{USER}}\n</div>";

    TemplateCache cache;
    ASSERT(cache.StringToTemplateCache(cache_key, text, DO_NOT_STRIP));
    ASSERT(cache.StringToTemplateCache(cache_key_inc, text_inc, DO_NOT_STRIP));

    const Template *tpl = cache.GetTemplate(cache_key, DO_NOT_STRIP);
    ASSERT(tpl);

    TemplateDictionary dict("dict");
    TemplateDictionary* sub_dict = dict.AddIncludeDictionary("INC");
    sub_dict->SetFilename(cache_key_inc);

    sub_dict->SetValue("USER", "John<>Doe");
    string expected = "<html><div>\n<p>\nUser John<>Doe\n</div></html>";
    AssertExpandWithCacheIs(&cache, cache_key, DO_NOT_STRIP, &dict, NULL,
                            expected, true);
  }